

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O0

void __thiscall
Common::
BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::BijectionMap(BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *il)

{
  const_iterator ppVar1;
  value_type *e;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *il_local;
  BijectionMap<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->currcount = 0;
  std::
  map<ICM::Instruction::Instruction,_unsigned_long,_std::less<ICM::Instruction::Instruction>,_std::allocator<std::pair<const_ICM::Instruction::Instruction,_unsigned_long>_>_>
  ::map(&this->keymap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->valmap);
  std::
  vector<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<ICM::Instruction::Instruction,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->data);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::deque(&this->destroyable);
  __end0 = std::
           initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(il);
  ppVar1 = std::
           initializer_list<std::pair<const_ICM::Instruction::Instruction,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(il);
  for (; __end0 != ppVar1; __end0 = __end0 + 1) {
    insert(this,&__end0->first,&__end0->second);
  }
  return;
}

Assistant:

BijectionMap(const std::initializer_list<value_type> &il) {
		for (const value_type &e : il)
			insert(e.first, e.second);
	}